

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall embree::SceneGraph::GroupNode::flat_to_round_curves(GroupNode *this)

{
  Node *pNVar1;
  pointer pRVar2;
  ulong uVar3;
  Ref<embree::SceneGraph::Node> local_38;
  Node *local_30;
  
  pRVar2 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar2) {
    uVar3 = 0;
    do {
      local_38.ptr = pRVar2[uVar3].ptr;
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_flat_to_round_curves((SceneGraph *)&local_30,&local_38);
      pRVar2 = (this->children).
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar1 = pRVar2[uVar3].ptr;
      if (pNVar1 != (Node *)0x0) {
        (*(pNVar1->super_RefCount)._vptr_RefCount[3])();
      }
      pRVar2[uVar3].ptr = local_30;
      local_30 = (Node *)0x0;
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar3 = uVar3 + 1;
      pRVar2 = (this->children).
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->children).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3));
  }
  return;
}

Assistant:

void bspline_to_bezier()
      {
        for (size_t i=0; i<children.size(); i++)
          children[i] = convert_bspline_to_bezier(children[i]);
      }